

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double bradford_sample(double a,double b,double c,int *seed)

{
  double dVar1;
  double x;
  double cdf;
  int *seed_local;
  double c_local;
  double b_local;
  double a_local;
  
  dVar1 = r8_uniform_01(seed);
  dVar1 = pow(c + 1.0,dVar1);
  return a + ((b - a) * (dVar1 - 1.0)) / c;
}

Assistant:

double bradford_sample ( double a, double b, double c, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    BRADFORD_SAMPLE samples the Bradford PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, C, the parameters of the PDF.
//    A < B,
//    0.0 < C.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double BRADFORD_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  double x;

  cdf = r8_uniform_01 ( seed );

  x = a + ( b - a ) * ( pow ( ( c + 1.0 ), cdf ) - 1.0 ) / c;

  return x;
}